

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

bool stackjit::TypeSystem::getClassAndFieldName(string *str,string *className,string *fieldName)

{
  long lVar1;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  lVar1 = std::__cxx11::string::find((char *)str,0x176147,0);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)str);
    std::__cxx11::string::operator=((string *)className,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    std::__cxx11::string::substr((ulong)local_48,(ulong)str);
    std::__cxx11::string::operator=((string *)fieldName,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return lVar1 != -1;
}

Assistant:

bool TypeSystem::getClassAndFieldName(std::string str,  std::string& className, std::string& fieldName) {
	    auto fieldSepPos = str.find("::");

	    if (fieldSepPos != std::string::npos) {
	        className = str.substr(0, fieldSepPos);
	        fieldName = str.substr(fieldSepPos + 2);
	        return true;
	    } else {
	    	return false;
	    }
	}